

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O0

bool __thiscall
dg::pta::LLVMPointerGraphBuilder::addFunctionToFork
          (LLVMPointerGraphBuilder *this,PSNode *function,PSNodeFork *forkNode)

{
  PSNode *pPVar1;
  SubgraphNode<dg::pta::PSNode> *this_00;
  PointerSubgraph *this_01;
  PSNodeFork *in_RDX;
  PSNodeFork *in_RSI;
  Function *in_RDI;
  PointerSubgraph *subgraph;
  Function *F;
  CallInst *CInst;
  
  pPVar1 = PSNodeFork::callInst(in_RDX);
  this_00 = (SubgraphNode<dg::pta::PSNode> *)
            SubgraphNode<dg::pta::PSNode>::getUserData<llvm::CallInst>
                      (&pPVar1->super_SubgraphNode<dg::pta::PSNode>);
  pPVar1 = (PSNode *)
           SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Function>
                     (&(in_RSI->super_PSNode).super_SubgraphNode<dg::pta::PSNode>);
  this_01 = createOrGetSubgraph((LLVMPointerGraphBuilder *)in_RDX,(Function *)this_00);
  addInterproceduralPthreadOperands((LLVMPointerGraphBuilder *)this_01,in_RDI,(CallInst *)0x1bc9a0);
  SubgraphNode<dg::pta::PSNode>::addSuccessor(this_00,pPVar1);
  PSNodeFork::addFunction(in_RSI,&in_RDX->super_PSNode);
  return true;
}

Assistant:

bool LLVMPointerGraphBuilder::addFunctionToFork(PSNode *function,
                                                PSNodeFork *forkNode) {
    const llvm::CallInst *CInst =
            forkNode->callInst()->getUserData<llvm::CallInst>();
    const llvm::Function *F = function->getUserData<llvm::Function>();

    DBG(pta,
        "Function '" << F->getName().str() << "' can be spawned via thread");

    PointerSubgraph &subgraph = createOrGetSubgraph(F);
    addInterproceduralPthreadOperands(F, CInst);
    // FIXME: create fork and join edges
    forkNode->addSuccessor(subgraph.root);
    forkNode->addFunction(function);

    return true;
}